

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O1

void __thiscall
duckdb::DependencyManager::CreateDependent
          (DependencyManager *this,CatalogTransaction transaction,DependencyInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  int iVar3;
  pointer pDVar4;
  undefined4 extraout_var;
  MangledEntryName entry_name;
  DependencyCatalogSet set;
  _Head_base<0UL,_duckdb::DependencyEntry_*,_false> local_b0;
  _Head_base<0UL,_duckdb::DependencyEntry_*,_false> local_a8;
  MangledEntryName local_a0;
  DependencyCatalogSet local_80;
  
  DependencyCatalogSet::DependencyCatalogSet(&local_80,&this->dependents,&(info->subject).entry);
  make_uniq_base<duckdb::DependencyEntry,duckdb::DependencyDependentEntry,duckdb::DuckCatalog&,duckdb::DependencyInfo_const&>
            ((duckdb *)&local_b0,this->catalog,info);
  pDVar4 = unique_ptr<duckdb::DependencyEntry,_std::default_delete<duckdb::DependencyEntry>,_true>::
           operator->((unique_ptr<duckdb::DependencyEntry,_std::default_delete<duckdb::DependencyEntry>,_true>
                       *)&local_b0);
  iVar3 = (*(pDVar4->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x11])(pDVar4);
  paVar1 = &local_a0.name.field_2;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar3);
  local_a0.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,lVar2,((long *)CONCAT44(extraout_var,iVar3))[1] + lVar2);
  local_a8._M_head_impl = local_b0._M_head_impl;
  local_b0._M_head_impl = (DependencyEntry *)0x0;
  DependencyCatalogSet::CreateEntry
            (&local_80,transaction,&local_a0,
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
             &local_a8);
  if (local_a8._M_head_impl != (DependencyEntry *)0x0) {
    (*((local_a8._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_a8._M_head_impl = (DependencyEntry *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.name._M_dataplus._M_p);
  }
  if (local_b0._M_head_impl != (DependencyEntry *)0x0) {
    (*((local_b0._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.mangled_name.name._M_dataplus._M_p != &local_80.mangled_name.name.field_2) {
    operator_delete(local_80.mangled_name.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.info.name._M_dataplus._M_p != &local_80.info.name.field_2) {
    operator_delete(local_80.info.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.info.schema._M_dataplus._M_p != &local_80.info.schema.field_2) {
    operator_delete(local_80.info.schema._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DependencyManager::CreateDependent(CatalogTransaction transaction, const DependencyInfo &info) {
	auto &from = info.subject.entry;

	DependencyCatalogSet set(Dependents(), from);
	auto dep = make_uniq_base<DependencyEntry, DependencyDependentEntry>(catalog, info);
	auto entry_name = dep->EntryMangledName();

	//! Add to the list of object that depend on 'subject'
	set.CreateEntry(transaction, entry_name, std::move(dep));
}